

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

GridListPanel * __thiscall GridListPanel::writeXml_abi_cxx11_(GridListPanel *this,int indent)

{
  int iVar1;
  ostream *poVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  Util local_2e0 [32];
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  GridListPanel *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar2 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar2,"<GridListPanel");
  std::__cxx11::string::~string((string *)local_1c8);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  poVar2 = std::operator<<(local_198,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"ScrollBarVisibility",&local_1f9);
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1a8,iVar1,(string *)local_1f8,this_00[1].type);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"ScrollOrientation",&local_221);
  Util::writeXmlElement<GridListScrollOrientation>
            ((stringstream *)local_1a8,iVar1,(string *)local_220,
             (GridListScrollOrientation)this_00[1].x);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"ItemWidth",&local_249);
  Util::writeXmlElement<float>
            ((stringstream *)local_1a8,iVar1,(string *)local_248,*(float *)&this_00[1]._vptr_Widget)
  ;
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"ItemHeight",&local_271);
  Util::writeXmlElement<float>
            ((stringstream *)local_1a8,iVar1,(string *)local_270,
             *(float *)((long)&this_00[1]._vptr_Widget + 4));
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"ListPanelItemName",&local_299);
  std::__cxx11::string::string(local_2c0,(string *)&this_00[1].numChildren);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1a8,iVar1,(string *)local_298,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  Widget::writeXmlChildren(this_00,(stringstream *)local_1a8,local_1c + 1);
  Util::getIndent_abi_cxx11_(local_2e0,local_1c);
  poVar2 = std::operator<<(local_198,(string *)local_2e0);
  std::operator<<(poVar2,"</GridListPanel>");
  std::__cxx11::string::~string((string *)local_2e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string GridListPanel::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<GridListPanel";
		writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "ScrollBarVisibility", scrollbarVisibility);
	Util::writeXmlElement(str, indent + 1, "ScrollOrientation", scrollOrientation);
	Util::writeXmlElement(str, indent + 1, "ItemWidth", itemWidth);
	Util::writeXmlElement(str, indent + 1, "ItemHeight", itemHeight);
	Util::writeXmlElement(str, indent + 1, "ListPanelItemName", listPanelItemName);

	Widget::writeXmlChildren(str, indent + 1);

	str << Util::getIndent(indent) << "</GridListPanel>";
	return str.str();
}